

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

string * __thiscall
CLI::Formatter::make_option_name_abi_cxx11_(Formatter *this,Option *opt,bool is_positional)

{
  byte in_CL;
  string *in_RDI;
  bool in_stack_00000316;
  bool in_stack_00000317;
  Option *in_stack_00000318;
  
  if ((in_CL & 1) == 0) {
    Option::get_name_abi_cxx11_(in_stack_00000318,in_stack_00000317,in_stack_00000316);
  }
  else {
    Option::get_name_abi_cxx11_(in_stack_00000318,in_stack_00000317,in_stack_00000316);
  }
  return in_RDI;
}

Assistant:

CLI11_INLINE std::string Formatter::make_option_name(const Option *opt, bool is_positional) const {
    if(is_positional)
        return opt->get_name(true, false);

    return opt->get_name(false, true);
}